

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O2

void __thiscall
avro::BufferCopyOutputStream::BufferCopyOutputStream
          (BufferCopyOutputStream *this,auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *out,
          size_t bufferSize)

{
  BufferCopyOut *pBVar1;
  uint8_t *puVar2;
  
  (this->super_OutputStream)._vptr_OutputStream =
       (_func_int **)&PTR__BufferCopyOutputStream_00190838;
  this->bufferSize_ = bufferSize;
  puVar2 = (uint8_t *)operator_new__(bufferSize);
  this->buffer_ = puVar2;
  pBVar1 = out->_M_ptr;
  out->_M_ptr = (BufferCopyOut *)0x0;
  (this->out_)._M_ptr = pBVar1;
  this->next_ = puVar2;
  this->available_ = bufferSize;
  this->byteCount_ = 0;
  return;
}

Assistant:

BufferCopyOutputStream(auto_ptr<BufferCopyOut> out, size_t bufferSize) :
        bufferSize_(bufferSize),
        buffer_(new uint8_t[bufferSize]),
        out_(out),
        next_(buffer_),
        available_(bufferSize_), byteCount_(0) { }